

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrontLoadedReporterFactory.cpp
# Opt level: O2

shared_ptr<ApprovalTests::Reporter> *
ApprovalTests::FrontLoadedReporterFactory::frontLoadedReporter(void)

{
  int iVar1;
  element_type *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  if (frontLoadedReporter()::reporter == '\0') {
    iVar1 = __cxa_guard_acquire(&frontLoadedReporter()::reporter);
    if (iVar1 != 0) {
      ::std::make_shared<ApprovalTests::DefaultFrontLoadedReporter>();
      frontLoadedReporter::reporter.
      super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_10._M_pi;
      frontLoadedReporter::reporter.
      super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_18;
      _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
      __cxa_atexit(::std::__shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&frontLoadedReporter::reporter,&__dso_handle);
      __cxa_guard_release(&frontLoadedReporter()::reporter);
    }
  }
  return &frontLoadedReporter::reporter;
}

Assistant:

std::shared_ptr<Reporter>& FrontLoadedReporterFactory::frontLoadedReporter()
    {
        static std::shared_ptr<Reporter> reporter =
            std::make_shared<DefaultFrontLoadedReporter>();
        return reporter;
    }